

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
hufDecode(uint64_t *hcode,HufDec *hdecod,uint8_t *in,uint64_t ni,uint32_t rlc,uint64_t no,
         uint16_t *out)

{
  uint16_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  exr_result_t eVar7;
  uint16_t *puVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint16_t *puVar14;
  int iVar15;
  exr_result_t in_R11D;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  byte *pbVar19;
  char cVar20;
  uint16_t *outb;
  exr_result_t local_64;
  
  puVar8 = out + no;
  pbVar19 = in + (ni + 7 >> 3);
  puVar14 = out;
  if (ni == 0) {
    iVar15 = 0;
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    iVar15 = 0;
    local_64 = in_R11D;
    do {
      bVar6 = *in;
      in = in + 1;
      uVar17 = uVar17 << 8 | (ulong)bVar6;
      iVar15 = iVar15 + 8;
      while (0xd < iVar15) {
        uVar9 = (ulong)(((uint)(uVar17 >> ((char)iVar15 - 0xeU & 0x3f)) & 0x3fff) << 4);
        iVar16 = *(int *)((long)&hdecod->len + uVar9);
        if (iVar16 == 0) {
          lVar4 = *(long *)((long)&hdecod->p + uVar9);
          if (lVar4 == 0) {
            cVar20 = '\x01';
            local_64 = 0x17;
          }
          else {
            uVar12 = *(uint *)((long)&hdecod->lit + uVar9);
            uVar13 = (ulong)uVar12;
            uVar18 = 0;
            uVar9 = uVar18;
            if (uVar13 != 0) {
              do {
                uVar2 = *(uint *)(lVar4 + uVar18 * 4);
                uVar9 = hcode[uVar2];
                uVar11 = (uint)uVar9 & 0x3f;
                while( true ) {
                  if (((int)uVar11 <= iVar15) || (pbVar19 <= in)) break;
                  bVar6 = *in;
                  in = in + 1;
                  uVar17 = (ulong)bVar6 | uVar17 << 8;
                  iVar15 = iVar15 + 8;
                }
                cVar20 = '\0';
                if ((int)uVar11 <= iVar15) {
                  iVar16 = iVar15 - uVar11;
                  if (uVar9 >> 6 ==
                      (~(-1L << ((byte)uVar9 & 0x3f)) & uVar17 >> ((byte)iVar16 & 0x3f))) {
                    if (uVar2 == rlc) {
                      if (iVar16 < 8) {
                        if (in < pbVar19) {
                          bVar6 = *in;
                          in = in + 1;
                          uVar17 = uVar17 << 8 | (ulong)bVar6;
                          iVar16 = iVar16 + 8;
                          goto LAB_00110eee;
                        }
LAB_00110f96:
                        cVar20 = '\x01';
                        local_64 = 1;
                        iVar15 = iVar16;
                      }
                      else {
LAB_00110eee:
                        iVar15 = iVar16 + -8;
                        uVar9 = uVar17 >> ((byte)iVar15 & 0x3f);
                        if (puVar8 < puVar14 + (uVar9 & 0xff)) {
                          local_64 = 0x17;
                          cVar20 = '\x01';
                        }
                        else {
                          iVar16 = iVar15;
                          if (puVar14 + -1 < out) goto LAB_00110f96;
                          cVar20 = '\n';
                          if ((char)uVar9 != '\0') {
                            uVar1 = puVar14[-1];
                            do {
                              *puVar14 = uVar1;
                              puVar14 = puVar14 + 1;
                              bVar6 = (char)uVar9 - 1;
                              uVar9 = (ulong)bVar6;
                            } while (bVar6 != 0);
                          }
                        }
                      }
                    }
                    else {
                      iVar15 = iVar16;
                      if (puVar14 < puVar8) {
                        *puVar14 = (uint16_t)uVar2;
                        puVar14 = puVar14 + 1;
                        cVar20 = '\n';
                      }
                      else {
                        local_64 = 0x17;
                        cVar20 = '\x01';
                      }
                    }
                  }
                  else {
                    cVar20 = '\0';
                  }
                }
                if (cVar20 != '\0') {
                  uVar9 = uVar18;
                  if (cVar20 != '\n') goto LAB_00111076;
                  break;
                }
                uVar18 = uVar18 + 1;
                uVar9 = uVar13;
              } while (uVar18 != uVar13);
            }
            cVar20 = (uint)uVar9 == uVar12;
            if ((bool)cVar20) {
              local_64 = 0x17;
            }
          }
LAB_00111076:
          if (cVar20 == '\0') {
LAB_001110ba:
            bVar5 = true;
          }
          else {
            bVar5 = false;
          }
        }
        else {
          eVar7 = 0x17;
          iVar10 = iVar15 - iVar16;
          if (iVar16 <= iVar15) {
            uVar3 = *(uint32_t *)((long)&hdecod->lit + uVar9);
            iVar15 = iVar10;
            if (uVar3 != rlc) {
              if (puVar14 < puVar8) {
                *puVar14 = (uint16_t)uVar3;
                puVar14 = puVar14 + 1;
                goto LAB_001110ba;
              }
LAB_0011108a:
              bVar5 = false;
              local_64 = eVar7;
              goto LAB_001110c3;
            }
            if (iVar10 < 8) {
              if (pbVar19 <= in) {
                eVar7 = 1;
                goto LAB_0011108a;
              }
              bVar6 = *in;
              in = in + 1;
              uVar17 = uVar17 << 8 | (ulong)bVar6;
              iVar10 = iVar10 + 8;
            }
            iVar15 = iVar10 + -8;
            uVar9 = uVar17 >> ((byte)iVar15 & 0x3f);
            if (puVar8 < puVar14 + (uVar9 & 0xff)) {
              local_64 = 0x17;
LAB_0011106d:
              bVar5 = false;
            }
            else {
              if (puVar14 + -1 < out) {
                local_64 = 1;
                goto LAB_0011106d;
              }
              bVar5 = true;
              if ((char)uVar9 != '\0') {
                uVar1 = puVar14[-1];
                do {
                  *puVar14 = uVar1;
                  puVar14 = puVar14 + 1;
                  bVar6 = (char)uVar9 - 1;
                  uVar9 = (ulong)bVar6;
                } while (bVar6 != 0);
              }
            }
            eVar7 = local_64;
            if (bVar5) goto LAB_001110ba;
          }
          bVar5 = false;
          local_64 = eVar7;
        }
LAB_001110c3:
        if (!bVar5) {
          return local_64;
        }
      }
      in_R11D = local_64;
    } while (in < pbVar19);
  }
  uVar12 = -(int)ni & 7;
  uVar17 = uVar17 >> (sbyte)uVar12;
  iVar15 = iVar15 - uVar12;
  do {
    if (iVar15 < 1) {
      return (uint)(puVar14 != puVar8);
    }
    uVar9 = (ulong)(((uint)(uVar17 << (0xeU - (char)iVar15 & 0x3f)) & 0x3fff) << 4);
    iVar16 = *(int *)((long)&hdecod->len + uVar9);
    bVar5 = false;
    eVar7 = 0x17;
    if ((iVar16 != 0) && (iVar10 = iVar15 - iVar16, iVar16 <= iVar15)) {
      uVar3 = *(uint32_t *)((long)&hdecod->lit + uVar9);
      if (uVar3 == rlc) {
        if (iVar10 < 8) {
          if (in < pbVar19) {
            bVar6 = *in;
            in = in + 1;
            uVar17 = uVar17 << 8 | (ulong)bVar6;
            iVar10 = iVar10 + 8;
            goto LAB_00111156;
          }
        }
        else {
LAB_00111156:
          iVar10 = iVar10 + -8;
          uVar9 = uVar17 >> ((byte)iVar10 & 0x3f);
          if (puVar8 < puVar14 + (uVar9 & 0xff)) goto LAB_001111a3;
          if (out <= puVar14 + -1) {
            if ((char)uVar9 != '\0') {
              uVar1 = puVar14[-1];
              do {
                *puVar14 = uVar1;
                puVar14 = puVar14 + 1;
                bVar6 = (char)uVar9 - 1;
                uVar9 = (ulong)bVar6;
              } while (bVar6 != 0);
            }
            goto LAB_0011119e;
          }
        }
        eVar7 = 1;
      }
      else if (puVar14 < puVar8) {
        *puVar14 = (uint16_t)uVar3;
        puVar14 = puVar14 + 1;
LAB_0011119e:
        bVar5 = true;
        iVar15 = iVar10;
        eVar7 = in_R11D;
        goto LAB_001111a5;
      }
LAB_001111a3:
      bVar5 = false;
      iVar15 = iVar10;
    }
LAB_001111a5:
    in_R11D = eVar7;
    if (!bVar5) {
      return in_R11D;
    }
  } while( true );
}

Assistant:

static exr_result_t
hufDecode (
    const uint64_t* hcode,  // i : encoding table
    const HufDec*   hdecod, // i : decoding table
    const uint8_t*  in,     // i : compressed input buffer
    uint64_t        ni,     // i : input size (in bits)
    uint32_t        rlc,    // i : run-length code
    uint64_t        no,     // i : expected output size (count of uint16 items)
    uint16_t*       out)
{
    uint64_t       c    = 0;
    int            lc   = 0;
    uint16_t*      outb = out;
    uint16_t*      oe   = out + no;
    const uint8_t* ie   = in + (ni + 7) / 8; // input byte size

    //
    // Loop on input bytes
    //

    while (in < ie)
    {
        getChar (c, lc, in);

        //
        // Access decoding table
        //

        while (lc >= HUF_DECBITS)
        {
            uint64_t      decoffset = (c >> (lc - HUF_DECBITS)) & HUF_DECMASK;
            const HufDec* pl        = hdecod + decoffset;

            if (pl->len)
            {
                //
                // Get short code
                //

                if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;

                lc -= pl->len;
                getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
            }
            else
            {
                uint32_t        j;
                const uint32_t* decbuf = pl->p;
                if (!pl->p) return EXR_ERR_CORRUPT_CHUNK; // wrong code

                //
                // Search long code
                //

                for (j = 0; j < pl->lit; j++)
                {
                    int l = hufLength (hcode[decbuf[j]]);

                    while (lc < l && in < ie) // get more bits
                    {
                        getChar (c, lc, in);
                    }

                    if (lc >= l)
                    {
                        if (hufCode (hcode[decbuf[j]]) ==
                            ((c >> (lc - l)) & (((uint64_t) (1) << l) - 1)))
                        {
                            //
                            // Found : get long code
                            //

                            lc -= l;
                            getCode (
                                decbuf[j], rlc, c, lc, in, ie, out, outb, oe);
                            break;
                        }
                    }
                }

                if (j == pl->lit) return EXR_ERR_CORRUPT_CHUNK;
            }
        }
    }

    //
    // Get remaining (short) codes
    //

    uint64_t i = (8 - ni) & 7;
    c >>= i;
    lc -= i;

    while (lc > 0)
    {
        uint64_t      decoffset = (c << (HUF_DECBITS - lc)) & HUF_DECMASK;
        const HufDec* pl        = hdecod + decoffset;

        if (pl->len)
        {
            if (pl->len > lc) return EXR_ERR_CORRUPT_CHUNK;
            lc -= pl->len;
            getCode (pl->lit, rlc, c, lc, in, ie, out, outb, oe);
        }
        else
            return EXR_ERR_CORRUPT_CHUNK;
    }

    if (out != oe) return EXR_ERR_OUT_OF_MEMORY;
    return EXR_ERR_SUCCESS;
}